

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall wallet::SQLiteBatch::SetupSQLStatements(SQLiteBatch *this)

{
  int iVar1;
  runtime_error *this_00;
  sqlite3_stmt **args;
  pointer ppVar2;
  long in_FS_OFFSET;
  initializer_list<std::pair<sqlite3_stmt_**,_const_char_*>_> __l;
  undefined8 local_a0;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  statements;
  undefined1 local_80 [32];
  sqlite3_stmt **local_60;
  char *local_58;
  sqlite3_stmt **local_50;
  char *local_48;
  sqlite3_stmt **local_40;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_80._0_8_ = &this->m_read_stmt;
  local_80._8_8_ = "SELECT value FROM main WHERE key = ?";
  local_80._16_8_ = &this->m_insert_stmt;
  local_80._24_8_ = "INSERT INTO main VALUES(?, ?)";
  local_60 = &this->m_overwrite_stmt;
  local_58 = "INSERT or REPLACE into main values(?, ?)";
  local_50 = &this->m_delete_stmt;
  local_48 = "DELETE FROM main WHERE key = ?";
  local_40 = &this->m_delete_prefix_stmt;
  local_38 = "DELETE FROM main WHERE instr(key, ?) = 1";
  __l._M_len = 5;
  __l._M_array = (iterator)local_80;
  std::
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::vector(&statements,__l,(allocator_type *)&local_a0);
  ppVar2 = statements.
           super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar2 == statements.
                  super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
      ::~_Vector_base(&statements.
                       super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                     );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
LAB_001ac932:
      __stack_chk_fail();
    }
    args = ppVar2->first;
    if (*args == (sqlite3_stmt *)0x0) {
      iVar1 = sqlite3_prepare_v2(this->m_database->m_db,ppVar2->second,0xffffffff,args,0);
      if (iVar1 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_a0 = sqlite3_errstr(iVar1);
        tinyformat::format<char_const*>
                  ((string *)local_80,
                   (tinyformat *)"SQLiteDatabase: Failed to setup SQL statements: %s\n",
                   (char *)&local_a0,(char **)args);
        std::runtime_error::runtime_error(this_00,(string *)local_80);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001ac932;
      }
    }
    ppVar2 = ppVar2 + 1;
  } while( true );
}

Assistant:

void SQLiteBatch::SetupSQLStatements()
{
    const std::vector<std::pair<sqlite3_stmt**, const char*>> statements{
        {&m_read_stmt, "SELECT value FROM main WHERE key = ?"},
        {&m_insert_stmt, "INSERT INTO main VALUES(?, ?)"},
        {&m_overwrite_stmt, "INSERT or REPLACE into main values(?, ?)"},
        {&m_delete_stmt, "DELETE FROM main WHERE key = ?"},
        {&m_delete_prefix_stmt, "DELETE FROM main WHERE instr(key, ?) = 1"},
    };

    for (const auto& [stmt_prepared, stmt_text] : statements) {
        if (*stmt_prepared == nullptr) {
            int res = sqlite3_prepare_v2(m_database.m_db, stmt_text, -1, stmt_prepared, nullptr);
            if (res != SQLITE_OK) {
                throw std::runtime_error(strprintf(
                    "SQLiteDatabase: Failed to setup SQL statements: %s\n", sqlite3_errstr(res)));
            }
        }
    }
}